

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

int binbuf_read_via_path(_binbuf *b,char *filename,char *dirname,int crflag)

{
  int iVar1;
  char *local_420;
  char *bufptr;
  char buf [1000];
  int filedesc;
  int crflag_local;
  char *dirname_local;
  char *filename_local;
  _binbuf *b_local;
  
  buf._996_4_ = crflag;
  buf._992_4_ = open_via_path(dirname,filename,"",(char *)&bufptr,&local_420,1000,0);
  if ((int)buf._992_4_ < 0) {
    pd_error((void *)0x0,"%s: can\'t open",filename);
    b_local._4_4_ = 1;
  }
  else {
    close(buf._992_4_);
    iVar1 = binbuf_read(b,local_420,(char *)&bufptr,buf._996_4_);
    if (iVar1 == 0) {
      b_local._4_4_ = 0;
    }
    else {
      b_local._4_4_ = 1;
    }
  }
  return b_local._4_4_;
}

Assistant:

int binbuf_read_via_path(t_binbuf *b, const char *filename, const char *dirname,
    int crflag)
{
    int filedesc;
    char buf[MAXPDSTRING], *bufptr;
    if ((filedesc = open_via_path(
        dirname, filename, "", buf, &bufptr, MAXPDSTRING, 0)) < 0)
    {
        pd_error(0, "%s: can't open", filename);
        return (1);
    }
    else close (filedesc);
    if (binbuf_read(b, bufptr, buf, crflag))
        return (1);
    else return (0);
}